

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::rescalePartialsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  int k;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  
  lVar11 = (long)this->gPatternPartitionsStartPatterns[partitionIndex];
  iVar1 = this->gPatternPartitionsStartPatterns[(long)partitionIndex + 1];
  do {
    if (iVar1 <= lVar11) {
      return;
    }
    auVar13 = ZEXT864(0) << 0x40;
    iVar5 = (int)lVar11 * this->kPartialsPaddedStateCount;
    iVar4 = this->kPartialsPaddedStateCount * this->kPaddedPatternCount;
    uVar6 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
    uVar7 = ~(this->kCategoryCount >> 0x1f) & this->kCategoryCount;
    iVar9 = iVar5;
    for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      lVar10 = 0;
      while (uVar6 != (uint)lVar10) {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = destP[iVar9 + lVar10];
        lVar10 = lVar10 + 1;
        auVar14 = vmaxsd_avx(auVar14,auVar13._0_16_);
        auVar13 = ZEXT1664(auVar14);
      }
      iVar9 = iVar9 + iVar4;
    }
    uVar2 = vcmpsd_avx512f(auVar13._0_16_,ZEXT816(0),0);
    bVar3 = (bool)((byte)uVar2 & 1);
    dVar12 = (double)((ulong)bVar3 * 0x3ff0000000000000 + (ulong)!bVar3 * auVar13._0_8_);
    for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      for (lVar10 = 0; uVar6 != (uint)lVar10; lVar10 = lVar10 + 1) {
        destP[iVar5 + lVar10] = (1.0 / dVar12) * destP[iVar5 + lVar10];
      }
      iVar5 = iVar5 + iVar4;
    }
    if ((this->kFlags & 0x400) == 0) {
      scaleFactors[lVar11] = dVar12;
      if (cumulativeScaleFactors != (double *)0x0) {
        dVar12 = log(dVar12);
LAB_0013689b:
        cumulativeScaleFactors[lVar11] = dVar12 + cumulativeScaleFactors[lVar11];
      }
    }
    else {
      dVar12 = log(dVar12);
      scaleFactors[lVar11] = dVar12;
      if (cumulativeScaleFactors != (double *)0x0) goto LAB_0013689b;
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(REALTYPE* destP,
                                                                   REALTYPE* scaleFactors,
                                                                   REALTYPE* cumulativeScaleFactors,
                                                                   const int fillWithOnes,
                                                                   const int partitionIndex) {

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    // TODO None of the code below has been optimized.
    for (int k = startPattern; k < endPattern; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}